

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

void game_loop_unix(int control)

{
  char *argument;
  CHAR_DATA *pCVar1;
  byte bVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  DESCRIPTOR_DATA *pDVar7;
  long lVar8;
  int *piVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  PC_DATA *pPVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  DESCRIPTOR_DATA *pDVar20;
  string_view fmt;
  string_view fmt_00;
  timeval last_time;
  timeval now_time;
  timeval stall_time;
  fd_set in_set;
  fd_set out_set;
  fd_set exc_set;
  __fd_mask a_Stack_11b8 [16];
  __fd_mask a_Stack_1138 [16];
  __fd_mask a_Stack_10b8 [472];
  timeval local_1f8;
  ulong local_1e8;
  timeval local_1e0;
  timeval local_1d0;
  char *local_1c0;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  uVar14 = (ulong)(uint)control;
  signal(0xd,(__sighandler_t)0x1);
  gettimeofday(&local_1f8,(__timezone_ptr_t)0x0);
  current_time = CONCAT44(local_1f8.tv_sec._4_4_,(int)local_1f8.tv_sec);
  if (merc_down == false) {
    iVar5 = control + 0x3f;
    if (-1 < control) {
      iVar5 = control;
    }
    uVar18 = 1L << ((byte)control & 0x3f);
    local_1e8 = uVar14;
    do {
      local_1b8.fds_bits[0] = 0;
      local_1b8.fds_bits[1] = 0;
      local_1b8.fds_bits[2] = 0;
      local_1b8.fds_bits[3] = 0;
      local_1b8.fds_bits[4] = 0;
      local_1b8.fds_bits[5] = 0;
      local_1b8.fds_bits[6] = 0;
      local_1b8.fds_bits[7] = 0;
      local_1b8.fds_bits[8] = 0;
      local_1b8.fds_bits[9] = 0;
      local_1b8.fds_bits[10] = 0;
      local_1b8.fds_bits[0xb] = 0;
      local_1b8.fds_bits[0xc] = 0;
      local_1b8.fds_bits[0xd] = 0;
      local_1b8.fds_bits[0xe] = 0;
      local_1b8.fds_bits[0xf] = 0;
      local_138.fds_bits[0] = 0;
      local_138.fds_bits[1] = 0;
      local_138.fds_bits[2] = 0;
      local_138.fds_bits[3] = 0;
      local_138.fds_bits[4] = 0;
      local_138.fds_bits[5] = 0;
      local_138.fds_bits[6] = 0;
      local_138.fds_bits[7] = 0;
      local_138.fds_bits[8] = 0;
      local_138.fds_bits[9] = 0;
      local_138.fds_bits[10] = 0;
      local_138.fds_bits[0xb] = 0;
      local_138.fds_bits[0xc] = 0;
      local_138.fds_bits[0xd] = 0;
      local_138.fds_bits[0xe] = 0;
      local_138.fds_bits[0xf] = 0;
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_1b8.fds_bits[iVar5 >> 6] = local_1b8.fds_bits[iVar5 >> 6] | uVar18;
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      iVar6 = (int)uVar14;
      if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
        uVar13 = uVar14 & 0xffffffff;
        pDVar7 = descriptor_list;
        do {
          sVar4 = pDVar7->descriptor;
          uVar10 = (uint)sVar4;
          if ((int)uVar13 <= (int)uVar10) {
            uVar13 = (ulong)uVar10;
          }
          iVar6 = (int)uVar13;
          uVar11 = uVar10 + 0x3f;
          if (-1 < sVar4) {
            uVar11 = uVar10;
          }
          uVar15 = 1L << ((byte)sVar4 & 0x3f);
          iVar12 = (int)uVar11 >> 6;
          local_1b8.fds_bits[iVar12] = local_1b8.fds_bits[iVar12] | uVar15;
          local_138.fds_bits[iVar12] = local_138.fds_bits[iVar12] | uVar15;
          local_b8.fds_bits[iVar12] = local_b8.fds_bits[iVar12] | uVar15;
          pDVar7 = pDVar7->next;
        } while (pDVar7 != (DESCRIPTOR_DATA *)0x0);
      }
      iVar6 = select(iVar6 + 1,&local_1b8,&local_138,&local_b8,(timeval *)&game_loop_unix::null_time
                    );
      if (iVar6 < 0) {
        piVar9 = __errno_location();
        local_1e0.tv_sec = (__time_t)strerror(*piVar9);
        fmt._M_str = "Game_loop: select poll: {}";
        fmt._M_len = 0x1a;
        CLogger::Error<char*>((CLogger *)&RS.field_0x140,fmt,(char **)&local_1e0);
        exit(0);
      }
      pDVar7 = descriptor_list;
      if ((local_1b8.fds_bits[iVar5 >> 6] & uVar18) != 0) {
        init_descriptor((int)uVar14);
        pDVar7 = descriptor_list;
      }
      while (pDVar20 = pDVar7, pDVar7 = descriptor_list, pDVar20 != (DESCRIPTOR_DATA *)0x0) {
        d_next = pDVar20->next;
        sVar4 = pDVar20->descriptor;
        uVar11 = (uint)sVar4;
        uVar10 = uVar11 + 0x3f;
        if (-1 < sVar4) {
          uVar10 = uVar11;
        }
        iVar6 = (int)uVar10 >> 6;
        pDVar7 = d_next;
        if (((ulong)local_b8.fds_bits[iVar6] >> ((ulong)uVar11 & 0x3f) & 1) != 0) {
          uVar13 = ~(1L << ((byte)sVar4 & 0x3f));
          local_1b8.fds_bits[iVar6] = local_1b8.fds_bits[iVar6] & uVar13;
          local_138.fds_bits[iVar6] = local_138.fds_bits[iVar6] & uVar13;
          pCVar1 = pDVar20->character;
          if ((pCVar1 != (CHAR_DATA *)0x0) && (1 < pCVar1->level)) {
            save_char_obj(pCVar1);
          }
          pDVar20->outtop = 0;
          close_socket(pDVar20);
          pDVar7 = d_next;
        }
      }
LAB_0027954e:
      pDVar20 = pDVar7;
      if (pDVar20 != (DESCRIPTOR_DATA *)0x0) {
        d_next = pDVar20->next;
        pDVar20->fcommand = false;
        uVar11 = (uint)pDVar20->descriptor;
        uVar10 = uVar11 + 0x3f;
        if (-1 < (int)uVar11) {
          uVar10 = uVar11;
        }
        if (((ulong)local_1b8.fds_bits[(int)uVar10 >> 6] >> ((ulong)uVar11 & 0x3f) & 1) != 0) {
          if (pDVar20->character != (CHAR_DATA *)0x0) {
            pDVar20->character->timer = 0;
          }
          bVar3 = read_from_descriptor(pDVar20);
          if (!bVar3) {
            sVar4 = pDVar20->descriptor;
            bVar2 = (byte)sVar4 & 0x3f;
            iVar6 = sVar4 + 0x3f;
            if (-1 < sVar4) {
              iVar6 = (int)sVar4;
            }
            local_138.fds_bits[iVar6 >> 6] =
                 local_138.fds_bits[iVar6 >> 6] &
                 (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
            pCVar1 = pDVar20->character;
            if ((pCVar1 != (CHAR_DATA *)0x0) && (1 < pCVar1->level)) {
              save_char_obj(pCVar1);
            }
            pDVar20->outtop = 0;
            close_socket(pDVar20);
            pDVar7 = d_next;
            goto LAB_0027954e;
          }
        }
        pCVar1 = pDVar20->character;
        if (pCVar1 == (CHAR_DATA *)0x0) {
LAB_002796d7:
          read_from_buffer(pDVar20);
          pDVar7 = d_next;
          if (pDVar20->incomm[0] != '\0') {
            argument = pDVar20->incomm;
            pDVar20->fcommand = true;
            stop_idling(pDVar20->character);
            if (pDVar20->showstr_point == (char *)0x0) {
              if (pDVar20->pString == (char **)0x0) {
                if (pDVar20->connected == 0) {
                  pPVar16 = pDVar20->character->pcdata;
                  if ((pPVar16 == (PC_DATA *)0x0) || (pPVar16->entering_text != true)) {
                    bVar3 = run_olc_editor(pDVar20);
                    if (!bVar3) {
                      substitute_alias(pDVar20,argument);
                    }
                  }
                  else {
                    process_text(pDVar20->character,argument);
                  }
                }
                else {
                  nanny(pDVar20,argument);
                }
              }
              else {
                string_add(pDVar20->character,argument);
              }
            }
            else {
              show_string(pDVar20,argument);
            }
            *argument = '\0';
            pDVar7 = d_next;
          }
        }
        else {
          if (0 < pCVar1->wait) {
            pCVar1->wait = pCVar1->wait + -1;
          }
          if (((pCVar1 == (CHAR_DATA *)0x0) || (0 < pCVar1->wait)) ||
             (pCVar1->pcdata->pending != true)) goto LAB_002796d7;
          interpret(pCVar1,pCVar1->pcdata->queue[0]);
          pDVar7 = d_next;
          if (pDVar20->character != (CHAR_DATA *)0x0) {
            pPVar16 = pDVar20->character->pcdata;
            sVar4 = pPVar16->write_next;
            if (1 < sVar4) {
              lVar17 = 1;
              lVar19 = 0x1f6e;
              do {
                strcpy((char *)((long)pPVar16 + lVar19 + -0x1200),
                       (char *)((long)&pPVar16->next + lVar19));
                lVar17 = lVar17 + 1;
                pPVar16 = pDVar20->character->pcdata;
                sVar4 = pPVar16->write_next;
                lVar19 = lVar19 + 0x1200;
                uVar14 = local_1e8;
              } while (lVar17 < sVar4);
            }
            sVar4 = sVar4 + -1;
            pPVar16->write_next = sVar4;
            if (sVar4 < 0x14) {
              lVar19 = (long)sVar4 * 0x1200 + 0xd6e;
              lVar17 = (long)sVar4 + -0x14;
              do {
                *(undefined1 *)((long)&pDVar20->character->pcdata->next + lVar19) = 0;
                lVar19 = lVar19 + 0x1200;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 0);
            }
            pPVar16 = pDVar20->character->pcdata;
            pDVar7 = d_next;
            if (pPVar16->write_next == 0) {
              pPVar16->pending = false;
              pDVar7 = d_next;
            }
          }
        }
        goto LAB_0027954e;
      }
      update_handler();
      pDVar7 = descriptor_list;
      while (pDVar20 = pDVar7, pDVar20 != (DESCRIPTOR_DATA *)0x0) {
        d_next = pDVar20->next;
        pDVar7 = d_next;
        if ((pDVar20->fcommand != false) || (0 < pDVar20->outtop)) {
          uVar11 = (uint)pDVar20->descriptor;
          uVar10 = uVar11 + 0x3f;
          if (-1 < (int)uVar11) {
            uVar10 = uVar11;
          }
          if ((((ulong)local_138.fds_bits[(int)uVar10 >> 6] >> ((ulong)uVar11 & 0x3f) & 1) != 0) &&
             (bVar3 = process_output(pDVar20,true), pDVar7 = d_next, !bVar3)) {
            pCVar1 = pDVar20->character;
            if ((pCVar1 != (CHAR_DATA *)0x0) && (1 < pCVar1->level)) {
              save_char_obj(pCVar1);
            }
            pDVar20->outtop = 0;
            close_socket(pDVar20);
            pDVar7 = d_next;
          }
        }
      }
      gettimeofday(&local_1e0,(__timezone_ptr_t)0x0);
      lVar17 = (long)(((int)local_1f8.tv_usec - (int)local_1e0.tv_usec) + 250000);
      lVar19 = (long)((int)local_1f8.tv_sec - (int)local_1e0.tv_sec);
      if (lVar17 < 0) {
        lVar8 = -1000000;
        if (-1000000 < lVar17) {
          lVar8 = lVar17;
        }
        uVar13 = ((lVar8 - lVar17) - (ulong)(lVar17 < -1000000)) / 1000000 +
                 (ulong)(lVar17 < -1000000);
        lVar17 = lVar17 + 1000000 + uVar13 * 1000000;
        lVar19 = lVar19 + ~uVar13;
      }
      if (999999 < lVar17) {
        lVar8 = 1999999;
        if (lVar17 < 1999999) {
          lVar8 = lVar17;
        }
        uVar13 = ((lVar17 - lVar8) + 999999U) / 1000000;
        lVar17 = lVar17 + -1000000 + uVar13 * -1000000;
        lVar19 = lVar19 + uVar13 + 1;
      }
      if (((0 < lVar19) || ((lVar19 == 0 && (0 < lVar17)))) &&
         (local_1d0.tv_sec = lVar19, local_1d0.tv_usec = lVar17,
         iVar6 = select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,&local_1d0), iVar6 < 0)) {
        piVar9 = __errno_location();
        local_1c0 = strerror(*piVar9);
        fmt_00._M_str = "Game_loop: select stall: {}";
        fmt_00._M_len = 0x1b;
        CLogger::Error<char*>((CLogger *)&RS.field_0x140,fmt_00,&local_1c0);
        exit(1);
      }
      gettimeofday(&local_1f8,(__timezone_ptr_t)0x0);
      current_time = CONCAT44(local_1f8.tv_sec._4_4_,(int)local_1f8.tv_sec);
    } while (merc_down != true);
  }
  return;
}

Assistant:

void game_loop_unix(int control)
{
	static struct timeval null_time;
	struct timeval last_time;

	signal(SIGPIPE, SIG_IGN);
	gettimeofday(&last_time, nullptr);
	current_time = (time_t)last_time.tv_sec;

	/* Main loop */
	while (!merc_down)
	{
		fd_set in_set;
		fd_set out_set;
		fd_set exc_set;
		DESCRIPTOR_DATA *d;
		int maxdesc;

#ifdef MALLOC_DEBUG
		if (malloc_verify() != 1)
			abort();
#endif

		/*
		 * Poll all active descriptors.
		 */
		FD_ZERO(&in_set);
		FD_ZERO(&out_set);
		FD_ZERO(&exc_set);
		FD_SET(control, &in_set);

		maxdesc = control;

		for (d = descriptor_list; d; d = d->next)
		{
			maxdesc = std::max(maxdesc, (int)d->descriptor);
			FD_SET(d->descriptor, &in_set);
			FD_SET(d->descriptor, &out_set);
			FD_SET(d->descriptor, &exc_set);
		}

		if (select(maxdesc + 1, &in_set, &out_set, &exc_set, &null_time) < 0)
		{
			RS.Logger.Error("Game_loop: select poll: {}", std::strerror(errno));
			exit(0);
		}

		/*
		 * New connection?
		 */
		if (FD_ISSET(control, &in_set))
			init_descriptor(control);

		/*
		 * Kick out the freaky folks.
		 */
		for (d = descriptor_list; d != nullptr; d = d_next)
		{
			d_next = d->next;

			if (FD_ISSET(d->descriptor, &exc_set))
			{
				FD_CLR(d->descriptor, &in_set);
				FD_CLR(d->descriptor, &out_set);

				if (d->character && d->character->level > 1)
					save_char_obj(d->character);

				d->outtop = 0;
				close_socket(d);
			}
		}

		/*
		 * Process input.
		 */
		for (d = descriptor_list; d != nullptr; d = d_next)
		{
			d_next = d->next;
			d->fcommand= false;

			if (FD_ISSET(d->descriptor, &in_set))
			{
				if (d->character != nullptr)
					d->character->timer = 0;

				if (!read_from_descriptor(d))
				{
					FD_CLR(d->descriptor, &out_set);

					if (d->character != nullptr && d->character->level > 1)
						save_char_obj(d->character);

					d->outtop = 0;
					close_socket(d);
					continue;
				}
			}

			if (d->character != nullptr && d->character->wait > 0)
				--d->character->wait;

			if (d->character != nullptr && d->character->wait <= 0 && d->character->pcdata->pending)
			{
				int i = 0;
				interpret(d->character, d->character->pcdata->queue[0]);

				if (!d->character) // Cal: Silly Morglum.  But what if we just interpreted a "quit"?
					continue;	   // then d->character is null and we just crashed. :(

				for (i = 1; i < d->character->pcdata->write_next; i++)
				{
					strcpy(d->character->pcdata->queue[(i - 1)], d->character->pcdata->queue[i]);
				}

				d->character->pcdata->write_next--;

				for (i = d->character->pcdata->write_next; i < MAX_QUEUE; i++)
				{
					d->character->pcdata->queue[i][0] = '\0';
				}

				if (d->character->pcdata->write_next == 0)
					d->character->pcdata->pending= false;

				continue;
				/*
					d->character->pcdata->queue[d->character->pcdata->read_next][0] = '\0';
					d->character->pcdata->read_next++;

					if (d->character->pcdata->read_next > 19)
						d->character->pcdata->read_next = 0;
					if (d->character->pcdata->queue[d->character->pcdata->read_next][0] == '\0')
						d->character->pcdata->pending= false;
				*/
			}

			read_from_buffer(d);
			if (d->incomm[0] != '\0')
			{
				d->fcommand = true;
				stop_idling(d->character);

				/* OLC */
				if (d->showstr_point)
				{
					show_string(d, d->incomm);
				}
				else if (d->pString)
				{
					string_add(d->character, d->incomm);
				}
				else if (d->connected == CON_PLAYING && d->character->pcdata && d->character->pcdata->entering_text)
				{
					process_text(d->character, d->incomm);
				}
				else
				{
					switch (d->connected)
					{
						case CON_PLAYING:
							if (!run_olc_editor(d))
								substitute_alias(d, d->incomm);
							break;
						default:
							nanny(d, d->incomm);
							break;
					}
				}
				/*		if (d->showstr_point)
							show_string(d,d->incomm);
						else if ( d->connected == CON_PLAYING && d->character->pcdata &&
				   d->character->pcdata->entering_text ) process_text(d->character, d->incomm); else if ( d->connected
				   == CON_PLAYING ) substitute_alias( d, d->incomm ); else nanny( d, d->incomm );
				*/
				d->incomm[0] = '\0';
			}
		}

		/*
		 * Autonomous game motion.
		 */
		update_handler();

		/*
		 * Output.
		 */
		for (d = descriptor_list; d != nullptr; d = d_next)
		{
			d_next = d->next;

			if ((d->fcommand || d->outtop > 0) && FD_ISSET(d->descriptor, &out_set))
			{
				if (!process_output(d, true))
				{
					if (d->character != nullptr && d->character->level > 1)
						save_char_obj(d->character);

					d->outtop = 0;
					close_socket(d);
				}
			}
		}

		/*
		 * Synchronize to a clock.
		 * Sleep( last_time + 1/PULSE_PER_SECOND - now ).
		 * Careful here of signed versus unsigned arithmetic.
		 */
		{
			struct timeval now_time;
			long secDelta;
			long usecDelta;

			gettimeofday(&now_time, nullptr);

			usecDelta = ((int)last_time.tv_usec) - ((int)now_time.tv_usec) + 1000000 / PULSE_PER_SECOND;
			secDelta = ((int)last_time.tv_sec) - ((int)now_time.tv_sec);

			while (usecDelta < 0)
			{
				usecDelta += 1000000;
				secDelta -= 1;
			}

			while (usecDelta >= 1000000)
			{
				usecDelta -= 1000000;
				secDelta += 1;
			}

			if (secDelta > 0 || (secDelta == 0 && usecDelta > 0))
			{
				struct timeval stall_time;

				stall_time.tv_usec = usecDelta;
				stall_time.tv_sec = secDelta;

				if (select(0, nullptr, nullptr, nullptr, &stall_time) < 0)
				{
					RS.Logger.Error("Game_loop: select stall: {}", std::strerror(errno));
					exit(1);
				}
			}
		}

		gettimeofday(&last_time, nullptr);
		current_time = (time_t)last_time.tv_sec;
	}
}